

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdGen * Cudd_FirstPrime(DdManager *dd,DdNode *l,DdNode *u,int **cube)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int local_54;
  int result;
  int length;
  DdNode *tmp;
  DdNode *prime;
  DdNode *implicant;
  DdGen *gen;
  int **cube_local;
  DdNode *u_local;
  DdNode *l_local;
  DdManager *dd_local;
  
  if (((dd == (DdManager *)0x0) || (l == (DdNode *)0x0)) || (u == (DdNode *)0x0)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    gen = (DdGen *)cube;
    cube_local = (int **)u;
    u_local = l;
    l_local = &dd->sentinel;
    implicant = (DdNode *)malloc(0x38);
    if (implicant == (DdNode *)0x0) {
      *(undefined4 *)((long)&l_local[0xf].type + 8) = 1;
      dd_local = (DdManager *)0x0;
    }
    else {
      *(DdNode **)implicant = l_local;
      *(undefined4 *)&implicant->next = 1;
      *(undefined4 *)((long)&implicant->next + 4) = 0;
      (implicant->type).value = 0.0;
      (implicant->type).kids.E = (DdNode *)cube_local;
      *(undefined4 *)&implicant->Id = 0;
      implicant[1].index = 0;
      implicant[1].ref = 0;
      implicant[1].next = u_local;
      *(int *)(((ulong)u_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)u_local & 0xfffffffffffffffe) + 4) + 1;
      pDVar2 = (DdNode *)malloc((long)*(int *)&l_local[3].type << 2);
      (implicant->type).kids.T = pDVar2;
      if ((implicant->type).kids.T == (DdNode *)0x0) {
        *(undefined4 *)((long)&l_local[0xf].type + 8) = 1;
        if (implicant != (DdNode *)0x0) {
          free(implicant);
        }
        dd_local = (DdManager *)0x0;
      }
      else {
        pDVar2 = implicant[1].next;
        pDVar3 = Cudd_ReadLogicZero((DdManager *)l_local);
        if (pDVar2 == pDVar3) {
          *(undefined4 *)((long)&implicant->next + 4) = 0;
        }
        else {
          prime = Cudd_LargestCube((DdManager *)l_local,implicant[1].next,&local_54);
          if (prime == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)l_local,implicant[1].next);
            if ((implicant->type).kids.T != (DdNode *)0x0) {
              free((implicant->type).kids.T);
              (implicant->type).value = 0.0;
            }
            if (implicant != (DdNode *)0x0) {
              free(implicant);
            }
            return (DdGen *)0x0;
          }
          *(int *)(((ulong)prime & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)prime & 0xfffffffffffffffe) + 4) + 1;
          tmp = Cudd_bddMakePrime((DdManager *)l_local,prime,(implicant->type).kids.E);
          if (tmp == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)l_local,implicant[1].next);
            Cudd_RecursiveDeref((DdManager *)l_local,prime);
            if ((implicant->type).kids.T != (DdNode *)0x0) {
              free((implicant->type).kids.T);
              (implicant->type).value = 0.0;
            }
            if (implicant != (DdNode *)0x0) {
              free(implicant);
            }
            return (DdGen *)0x0;
          }
          *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref((DdManager *)l_local,prime);
          _result = Cudd_bddAnd((DdManager *)l_local,implicant[1].next,(DdNode *)((ulong)tmp ^ 1));
          if (_result == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)l_local,implicant[1].next);
            Cudd_RecursiveDeref((DdManager *)l_local,tmp);
            if ((implicant->type).kids.T != (DdNode *)0x0) {
              free((implicant->type).kids.T);
              (implicant->type).value = 0.0;
            }
            if (implicant != (DdNode *)0x0) {
              free(implicant);
            }
            return (DdGen *)0x0;
          }
          *(int *)(((ulong)_result & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)_result & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref((DdManager *)l_local,implicant[1].next);
          implicant[1].next = _result;
          iVar1 = Cudd_BddToCubeArray((DdManager *)l_local,tmp,(int *)(implicant->type).kids.T);
          if (iVar1 == 0) {
            Cudd_RecursiveDeref((DdManager *)l_local,implicant[1].next);
            Cudd_RecursiveDeref((DdManager *)l_local,tmp);
            if ((implicant->type).kids.T != (DdNode *)0x0) {
              free((implicant->type).kids.T);
              (implicant->type).value = 0.0;
            }
            if (implicant != (DdNode *)0x0) {
              free(implicant);
            }
            return (DdGen *)0x0;
          }
          Cudd_RecursiveDeref((DdManager *)l_local,tmp);
          *(undefined4 *)((long)&implicant->next + 4) = 1;
        }
        gen->manager = (DdManager *)(implicant->type).value;
        dd_local = (DdManager *)implicant;
      }
    }
  }
  return (DdGen *)dd_local;
}

Assistant:

DdGen *
Cudd_FirstPrime(
  DdManager *dd,
  DdNode *l,
  DdNode *u,
  int **cube)
{
    DdGen *gen;
    DdNode *implicant, *prime, *tmp;
    int length, result;

    /* Sanity Check. */
    if (dd == NULL || l == NULL || u == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_PRIMES;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.primes.cube = NULL;
    gen->gen.primes.ub = u;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = l;
    cuddRef(l);

    gen->gen.primes.cube = ABC_ALLOC(int,dd->size);
    if (gen->gen.primes.cube == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }

    if (gen->node == Cudd_ReadLogicZero(dd)) {
        gen->status = CUDD_GEN_EMPTY;
    } else {
        implicant = Cudd_LargestCube(dd,gen->node,&length);
        if (implicant == NULL) {
            Cudd_RecursiveDeref(dd,gen->node);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,gen->gen.primes.ub);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,gen->node);
            Cudd_RecursiveDeref(dd,implicant);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,gen->node,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,gen->node);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,gen->node);
        gen->node = tmp;
        result = Cudd_BddToCubeArray(dd,prime,gen->gen.primes.cube);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,gen->node);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        Cudd_RecursiveDeref(dd,prime);
        gen->status = CUDD_GEN_NONEMPTY;
    }
    *cube = gen->gen.primes.cube;
    return(gen);

}